

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O0

int order_features<feature>(void *first,void *second)

{
  void *second_local;
  void *first_local;
  undefined4 local_4;
  
  if (*(long *)((long)first + 8) == *(long *)((long)second + 8)) {
    if (*first < *second || *first == *second) {
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = (int)*(undefined8 *)((long)first + 8) - (int)*(undefined8 *)((long)second + 8);
  }
  return local_4;
}

Assistant:

inline int order_features(const void* first, const void* second)
{
  if (((T*)first)->weight_index != ((T*)second)->weight_index)
    return (int)(((T*)first)->weight_index - ((T*)second)->weight_index);
  else if (((T*)first)->x > ((T*)second)->x)
    return 1;
  else
    return -1;
}